

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::makeSwitch
          (Builder *this,Id selector,uint control,int numSegments,
          vector<int,_std::allocator<int>_> *caseValues,
          vector<int,_std::allocator<int>_> *valueIndexToSegment,int defaultSegment,
          vector<spv::Block_*,_std::allocator<spv::Block_*>_> *segmentBlocks)

{
  int iVar1;
  Id IVar2;
  Block *pBVar3;
  size_type sVar4;
  reference ppBVar5;
  uint *puVar6;
  const_reference pvVar7;
  Block *local_a8;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_70;
  int local_64;
  Block *pBStack_60;
  int i;
  Block *defaultOrMerge;
  Instruction *switchInst;
  Block *mergeBlock;
  int local_3c;
  Function *pFStack_38;
  int s;
  Function *function;
  vector<int,_std::allocator<int>_> *valueIndexToSegment_local;
  vector<int,_std::allocator<int>_> *caseValues_local;
  uint local_18;
  int numSegments_local;
  uint control_local;
  Id selector_local;
  Builder *this_local;
  
  function = (Function *)valueIndexToSegment;
  valueIndexToSegment_local = caseValues;
  caseValues_local._4_4_ = numSegments;
  local_18 = control;
  numSegments_local = selector;
  _control_local = this;
  pFStack_38 = Block::getParent(this->buildPoint);
  for (local_3c = 0; local_3c < caseValues_local._4_4_; local_3c = local_3c + 1) {
    pBVar3 = (Block *)::operator_new(0x90);
    IVar2 = getUniqueId(this);
    Block::Block(pBVar3,IVar2,pFStack_38);
    mergeBlock = pBVar3;
    std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::push_back(segmentBlocks,&mergeBlock);
  }
  pBVar3 = (Block *)::operator_new(0x90);
  IVar2 = getUniqueId(this);
  Block::Block(pBVar3,IVar2,pFStack_38);
  switchInst = (Instruction *)pBVar3;
  createSelectionMerge(this,pBVar3,local_18);
  pBVar3 = (Block *)::operator_new(0x60);
  spv::Instruction::Instruction((Instruction *)pBVar3,0,0,OpSwitch);
  defaultOrMerge = pBVar3;
  sVar4 = std::vector<int,_std::allocator<int>_>::size(valueIndexToSegment_local);
  spv::Instruction::reserveOperands((Instruction *)pBVar3,sVar4 * 2 + 2);
  spv::Instruction::addIdOperand((Instruction *)defaultOrMerge,numSegments_local);
  if (defaultSegment < 0) {
    local_a8 = (Block *)switchInst;
  }
  else {
    ppBVar5 = std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::operator[]
                        (segmentBlocks,(long)defaultSegment);
    local_a8 = *ppBVar5;
  }
  pBVar3 = defaultOrMerge;
  pBStack_60 = local_a8;
  IVar2 = Block::getId(local_a8);
  spv::Instruction::addIdOperand((Instruction *)pBVar3,IVar2);
  Block::addPredecessor(pBStack_60,this->buildPoint);
  local_64 = 0;
  while( true ) {
    iVar1 = local_64;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(valueIndexToSegment_local);
    pBVar3 = defaultOrMerge;
    if ((int)sVar4 <= iVar1) break;
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (valueIndexToSegment_local,(long)local_64);
    spv::Instruction::addImmediateOperand((Instruction *)pBVar3,*puVar6);
    pBVar3 = defaultOrMerge;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)function,(long)local_64);
    ppBVar5 = std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::operator[]
                        (segmentBlocks,(long)*pvVar7);
    IVar2 = Block::getId(*ppBVar5);
    spv::Instruction::addIdOperand((Instruction *)pBVar3,IVar2);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)function,(long)local_64);
    ppBVar5 = std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::operator[]
                        (segmentBlocks,(long)*pvVar7);
    Block::addPredecessor(*ppBVar5,this->buildPoint);
    local_64 = local_64 + 1;
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_70,
             (pointer)defaultOrMerge);
  addInstruction(this,&local_70);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_70);
  std::stack<spv::Block_*,_std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>_>::push
            (&this->switchMerges,(value_type *)&switchInst);
  return;
}

Assistant:

void Builder::makeSwitch(Id selector, unsigned int control, int numSegments, const std::vector<int>& caseValues,
                         const std::vector<int>& valueIndexToSegment, int defaultSegment,
                         std::vector<Block*>& segmentBlocks)
{
    Function& function = buildPoint->getParent();

    // make all the blocks
    for (int s = 0; s < numSegments; ++s)
        segmentBlocks.push_back(new Block(getUniqueId(), function));

    Block* mergeBlock = new Block(getUniqueId(), function);

    // make and insert the switch's selection-merge instruction
    createSelectionMerge(mergeBlock, control);

    // make the switch instruction
    Instruction* switchInst = new Instruction(NoResult, NoType, OpSwitch);
    switchInst->reserveOperands((caseValues.size() * 2) + 2);
    switchInst->addIdOperand(selector);
    auto defaultOrMerge = (defaultSegment >= 0) ? segmentBlocks[defaultSegment] : mergeBlock;
    switchInst->addIdOperand(defaultOrMerge->getId());
    defaultOrMerge->addPredecessor(buildPoint);
    for (int i = 0; i < (int)caseValues.size(); ++i) {
        switchInst->addImmediateOperand(caseValues[i]);
        switchInst->addIdOperand(segmentBlocks[valueIndexToSegment[i]]->getId());
        segmentBlocks[valueIndexToSegment[i]]->addPredecessor(buildPoint);
    }
    addInstruction(std::unique_ptr<Instruction>(switchInst));

    // push the merge block
    switchMerges.push(mergeBlock);
}